

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.h
# Opt level: O1

void __thiscall
llama_model_loader::llama_tensor_weight::llama_tensor_weight
          (llama_tensor_weight *this,llama_file *file,uint16_t idx,gguf_context *gguf_ctx,
          ggml_tensor *tensor)

{
  ulong uVar1;
  uint uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  runtime_error *prVar8;
  string local_50;
  
  this->idx = idx;
  this->tensor = tensor;
  uVar3 = ggml_get_name(tensor);
  uVar2 = gguf_find_tensor(gguf_ctx,uVar3);
  if ((int)uVar2 < 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar3 = ggml_get_name(tensor);
    format_abi_cxx11_(&local_50,"tensor \'%s\' not found in the model",uVar3);
    std::runtime_error::runtime_error(prVar8,(string *)&local_50);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar4 = gguf_get_data_offset(gguf_ctx);
  lVar5 = gguf_get_tensor_offset(gguf_ctx,uVar2 & 0x7fffffff);
  this->offs = lVar5 + lVar4;
  lVar6 = ggml_nbytes(tensor);
  uVar1 = this->offs;
  if (uVar1 <= (ulong)(lVar6 + lVar5 + lVar4)) {
    lVar4 = ggml_nbytes(tensor);
    sVar7 = llama_file::size(file);
    if (lVar4 + uVar1 <= sVar7) {
      return;
    }
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  uVar3 = ggml_get_name(tensor);
  format_abi_cxx11_(&local_50,
                    "tensor \'%s\' data is not within the file bounds, model is corrupted or incomplete"
                    ,uVar3);
  std::runtime_error::runtime_error(prVar8,(string *)&local_50);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

llama_tensor_weight(const llama_file * file, uint16_t idx, const struct gguf_context * gguf_ctx, ggml_tensor * tensor) : idx(idx), tensor(tensor) {
            const int tensor_idx = gguf_find_tensor(gguf_ctx,  ggml_get_name(tensor));
            if (tensor_idx < 0) {
                throw std::runtime_error(format("tensor '%s' not found in the model", ggml_get_name(tensor)));
            }

            offs = gguf_get_data_offset(gguf_ctx) + gguf_get_tensor_offset(gguf_ctx, tensor_idx);
            if (offs + ggml_nbytes(tensor) < offs || offs + ggml_nbytes(tensor) > file->size()) {
                throw std::runtime_error(format("tensor '%s' data is not within the file bounds, model is corrupted or incomplete", ggml_get_name(tensor)));
            }
        }